

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromSkeleton
          (PatternMap *this,PtnSkeleton *skeleton,PtnSkeleton **specifiedSkeletonPtr)

{
  UChar baseChar_00;
  PtnElem *pPVar1;
  PtnSkeleton *pPVar2;
  char local_33;
  UBool equal;
  UChar baseChar;
  PtnElem *curElem;
  PtnSkeleton **specifiedSkeletonPtr_local;
  PtnSkeleton *skeleton_local;
  PatternMap *this_local;
  
  if (specifiedSkeletonPtr != (PtnSkeleton **)0x0) {
    *specifiedSkeletonPtr = (PtnSkeleton *)0x0;
  }
  baseChar_00 = PtnSkeleton::getFirstChar(skeleton);
  pPVar1 = getHeader(this,baseChar_00);
  while( true ) {
    if (pPVar1 == (PtnElem *)0x0) {
      return (UnicodeString *)0x0;
    }
    if (specifiedSkeletonPtr == (PtnSkeleton **)0x0) {
      pPVar2 = LocalPointerBase<icu_63::PtnSkeleton>::operator->
                         (&(pPVar1->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
      local_33 = SkeletonFields::operator==(&pPVar2->baseOriginal,&skeleton->baseOriginal);
    }
    else {
      pPVar2 = LocalPointerBase<icu_63::PtnSkeleton>::operator->
                         (&(pPVar1->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
      local_33 = SkeletonFields::operator==(&pPVar2->original,&skeleton->original);
    }
    if (local_33 != '\0') break;
    pPVar1 = LocalPointerBase<icu_63::PtnElem>::getAlias
                       (&(pPVar1->next).super_LocalPointerBase<icu_63::PtnElem>);
  }
  if ((specifiedSkeletonPtr != (PtnSkeleton **)0x0) && (pPVar1->skeletonWasSpecified != '\0')) {
    pPVar2 = LocalPointerBase<icu_63::PtnSkeleton>::getAlias
                       (&(pPVar1->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
    *specifiedSkeletonPtr = pPVar2;
  }
  return &pPVar1->pattern;
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromSkeleton(const PtnSkeleton& skeleton, const PtnSkeleton** specifiedSkeletonPtr) const { // key to search for
   PtnElem *curElem;

   if (specifiedSkeletonPtr) {
       *specifiedSkeletonPtr = nullptr;
   }

   // find boot entry
   UChar baseChar = skeleton.getFirstChar();
   if ((curElem=getHeader(baseChar))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       UBool equal;
       if (specifiedSkeletonPtr != nullptr) { // called from DateTimePatternGenerator::getBestRaw or addPattern, use original
           equal = curElem->skeleton->original == skeleton.original;
       } else { // called from DateTimePatternGenerator::getRedundants, use baseOriginal
           equal = curElem->skeleton->baseOriginal == skeleton.baseOriginal;
       }
       if (equal) {
           if (specifiedSkeletonPtr && curElem->skeletonWasSpecified) {
               *specifiedSkeletonPtr = curElem->skeleton.getAlias();
           }
           return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}